

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

Rollup * bloaty::Rollup::GetEmpty(void)

{
  Rollup *pRVar1;
  
  if (empty_ == (Rollup *)0x0) {
    pRVar1 = (Rollup *)operator_new(0x60);
    Rollup((Rollup *)0x1a0ea7);
    empty_ = pRVar1;
  }
  return empty_;
}

Assistant:

static Rollup* GetEmpty() {
    if (!empty_) {
      empty_ = new Rollup();
    }
    return empty_;
  }